

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect local_30;
  
  fVar14 = (window->InnerRect).Min.x;
  fVar11 = (window->InnerRect).Min.y;
  fVar13 = 1.0;
  uVar7 = flags;
  if ((flags & 0x15U) == 0) {
    uVar7 = (uint)window->ScrollbarX | flags;
  }
  fVar16 = fVar14 + -1.0;
  fVar9 = fVar11 + -1.0;
  fVar10 = (window->InnerRect).Max.x + 1.0;
  fVar12 = (window->InnerRect).Max.y + 1.0;
  if ((uVar7 & 0x2a) == 0) {
    uVar6 = 2;
    if (window->Appearing != false) {
      uVar6 = 0x20;
    }
    uVar7 = uVar7 | uVar6;
  }
  fVar15 = (item_rect->Min).x;
  fVar8 = (item_rect->Min).y;
  fVar1 = (item_rect->Max).x;
  fVar2 = (item_rect->Max).y;
  fVar3 = (GImGui->Style).ItemSpacing.x;
  fVar4 = (GImGui->Style).ItemSpacing.y;
  fVar17 = fVar3 + fVar3 + (fVar1 - fVar15);
  if (((uVar7 & 1) == 0) || (fVar1 <= fVar10 && fVar16 <= fVar15)) {
    if (((uVar7 & 0x10) != 0) || ((uVar7 & 4) != 0 && (fVar1 > fVar10 || fVar16 > fVar15))) {
      fVar13 = 0.0;
      if (fVar17 <= fVar10 - fVar16) {
        fVar15 = (float)(int)(((fVar15 + fVar1) - ((window->InnerRect).Max.x - fVar14)) * 0.5);
      }
      goto LAB_0011b883;
    }
  }
  else {
    if ((fVar15 < fVar16) || (fVar10 - fVar16 < fVar17)) {
      fVar15 = fVar15 - fVar3;
      fVar13 = 0.0;
    }
    else {
      if (fVar1 < fVar10) goto LAB_0011b8ab;
      fVar15 = fVar1 + fVar3;
    }
LAB_0011b883:
    (window->ScrollTarget).x = (float)(int)((fVar15 - (window->Pos).x) + (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = fVar13;
    (window->ScrollTargetEdgeSnapDist).x = 0.0;
  }
LAB_0011b8ab:
  fVar14 = fVar4 + fVar4 + (fVar2 - fVar8);
  if ((uVar7 & 2) == 0 || fVar2 <= fVar12 && fVar9 <= fVar8) {
    if (((uVar7 & 0x20) == 0) && ((uVar7 & 8) == 0 || fVar2 <= fVar12 && fVar9 <= fVar8))
    goto LAB_0011b93d;
    fVar13 = 0.0;
    if (fVar14 <= fVar12 - fVar9) {
      fVar8 = (float)(int)(((fVar8 + fVar2) - ((window->InnerRect).Max.y - fVar11)) * 0.5);
    }
  }
  else if ((fVar8 < fVar9) || (fVar12 - fVar9 < fVar14)) {
    fVar8 = fVar8 - fVar4;
    fVar13 = 0.0;
  }
  else {
    if (fVar2 < fVar12) goto LAB_0011b93d;
    fVar8 = fVar2 + fVar4;
    fVar13 = 1.0;
  }
  SetScrollFromPosY(window,fVar8 - (window->Pos).y,fVar13);
LAB_0011b93d:
  IVar5 = CalcNextScrollFromScrollTargetAndClamp(window);
  fVar14 = IVar5.x - (window->Scroll).x;
  fVar11 = IVar5.y - (window->Scroll).y;
  if (((uVar7 & 0x40) == 0) && ((window->Flags & 0x1000000) != 0)) {
    uVar7 = (flags & 0xffffffeaU) + 1;
    if ((flags & 0x14U) == 0) {
      uVar7 = flags;
    }
    uVar6 = uVar7 & 0xffffffc1 | 2;
    if ((uVar7 & 0x28) == 0) {
      uVar6 = uVar7;
    }
    local_30.Min.x = (item_rect->Min).x - fVar14;
    local_30.Min.y = (item_rect->Min).y - fVar11;
    local_30.Max.x = (item_rect->Max).x - fVar14;
    local_30.Max.y = (item_rect->Max).y - fVar11;
    IVar5 = ScrollToRectEx(window->ParentWindow,&local_30,uVar6);
    fVar14 = fVar14 + IVar5.x;
    fVar11 = fVar11 + IVar5.y;
  }
  IVar5.y = fVar11;
  IVar5.x = fVar14;
  return IVar5;
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= window_rect.Min.x && item_rect.Max.x <= window_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= window_rect.Min.y && item_rect.Max.y <= window_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= window_rect.GetWidth();
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= window_rect.GetHeight();

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < window_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        float target_x = can_be_fully_visible_x ? ImFloor((item_rect.Min.x + item_rect.Max.x - window->InnerRect.GetWidth()) * 0.5f) : item_rect.Min.x;
        SetScrollFromPosX(window, target_x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < window_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        float target_y = can_be_fully_visible_y ? ImFloor((item_rect.Min.y + item_rect.Max.y - window->InnerRect.GetHeight()) * 0.5f) : item_rect.Min.y;
        SetScrollFromPosY(window, target_y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}